

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_completeRangeTypesRational(SoPlexBase<double> *this)

{
  int iVar1;
  SoPlexBase<double> *this_00;
  long in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_ffffffffffffffb0;
  SoPlexBase<double> *in_stack_ffffffffffffffb8;
  undefined4 local_14;
  undefined4 local_c;
  
  local_c = DataArray<soplex::SoPlexBase<double>::RangeType>::size
                      ((DataArray<soplex::SoPlexBase<double>::RangeType> *)(in_RDI + 0x4d38));
  while( true ) {
    iVar1 = numColsRational((SoPlexBase<double> *)0x4569a5);
    if (iVar1 <= local_c) break;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::lower(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::upper(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    _rangeTypeRational(in_stack_ffffffffffffffb8,(Rational *)in_stack_ffffffffffffffb0,
                       (Rational *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    DataArray<soplex::SoPlexBase<double>::RangeType>::append
              ((DataArray<soplex::SoPlexBase<double>::RangeType> *)in_stack_ffffffffffffffb0,
               (RangeType *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_c = local_c + 1;
  }
  local_14 = DataArray<soplex::SoPlexBase<double>::RangeType>::size
                       ((DataArray<soplex::SoPlexBase<double>::RangeType> *)(in_RDI + 0x4d50));
  while( true ) {
    iVar1 = numRowsRational((SoPlexBase<double> *)0x456a4c);
    if (iVar1 <= local_14) break;
    this_00 = (SoPlexBase<double> *)(in_RDI + 0x4d50);
    in_stack_ffffffffffffffb0 =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::lhs(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::rhs(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    _rangeTypeRational(this_00,(Rational *)in_stack_ffffffffffffffb0,
                       (Rational *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    DataArray<soplex::SoPlexBase<double>::RangeType>::append
              ((DataArray<soplex::SoPlexBase<double>::RangeType> *)in_stack_ffffffffffffffb0,
               (RangeType *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_completeRangeTypesRational()
{
   // we use one method for bot columns and rows, because during column/row addition, rows/columns can be added
   // implicitly
   for(int i = _colTypes.size(); i < numColsRational(); i++)
      _colTypes.append(_rangeTypeRational(_rationalLP->lower(i), _rationalLP->upper(i)));

   for(int i = _rowTypes.size(); i < numRowsRational(); i++)
      _rowTypes.append(_rangeTypeRational(_rationalLP->lhs(i), _rationalLP->rhs(i)));
}